

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int unixCurrentTime(sqlite3_vfs *NotUsed,double *prNow)

{
  long lVar1;
  int iVar2;
  sqlite3_int64 *in_RSI;
  sqlite3_vfs *in_RDI;
  long in_FS_OFFSET;
  int rc;
  sqlite3_int64 i;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = unixCurrentTimeInt64(in_RDI,in_RSI);
  *in_RSI = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

static int unixCurrentTime(sqlite3_vfs *NotUsed, double *prNow){
  sqlite3_int64 i = 0;
  int rc;
  UNUSED_PARAMETER(NotUsed);
  rc = unixCurrentTimeInt64(0, &i);
  *prNow = i/86400000.0;
  return rc;
}